

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteConstant<unsigned_char,unsigned_char,unsigned_char,duckdb::BinaryStandardOperatorWrapper,duckdb::DecimalSubtractOverflowCheck,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  unsigned_long *puVar1;
  InternalException *this;
  size_type __dnew;
  size_type local_48;
  string local_40;
  
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  puVar1 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if (((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) &&
     ((puVar1 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
      puVar1 == (unsigned_long *)0x0 || ((*puVar1 & 1) != 0)))) {
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    local_48 = 0x29;
    local_40._M_dataplus._M_p =
         (pointer)::std::__cxx11::string::_M_create((ulong *)&local_40,(ulong)&local_48);
    local_40.field_2._M_allocated_capacity = local_48;
    builtin_strncpy(local_40._M_dataplus._M_p,"Unimplemented type for TryDecimalSubtract",0x29);
    local_40._M_string_length = local_48;
    local_40._M_dataplus._M_p[local_48] = '\0';
    InternalException::InternalException(this,&local_40);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}